

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filecrt.cpp
# Opt level: O0

size_t __thiscall
CorUnix::InternalFwrite
          (CorUnix *this,void *pvBuffer,size_t nSize,size_t nCount,FILE *f,INT *pnErrorCode)

{
  size_t sVar1;
  size_t nWrittenBytes;
  INT *pnErrorCode_local;
  FILE *f_local;
  size_t nCount_local;
  size_t nSize_local;
  void *pvBuffer_local;
  
  if (nCount == 0) {
    fprintf(_stderr,"] %s %s:%d","InternalFwrite",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/filecrt.cpp"
            ,0x21e,pnErrorCode,0);
    fprintf(_stderr,"Expression: f != NULL\n");
  }
  sVar1 = fwrite(this,(size_t)pvBuffer,nSize,(FILE *)nCount);
  if (sVar1 < nSize) {
    *(undefined4 *)f = 1;
  }
  return sVar1;
}

Assistant:

size_t
CorUnix::InternalFwrite(
    const void *pvBuffer,
    size_t nSize,
    size_t nCount,
    FILE *f,
    INT *pnErrorCode
    )
{
    size_t nWrittenBytes = 0;
    _ASSERTE(f != NULL);

#if FILE_OPS_CHECK_FERROR_OF_PREVIOUS_CALL
    clearerr(f);
#endif

    nWrittenBytes = fwrite(pvBuffer, nSize, nCount, f);

    // Make sure no error occurred.
    if ( nWrittenBytes < nCount )
    {
        // Set the FILE* error code
        *pnErrorCode = PAL_FILE_ERROR;
    }

    return nWrittenBytes;
}